

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lattices.cpp
# Opt level: O3

void __thiscall TupleLattice_GetBottom_Test::TestBody(TupleLattice_GetBottom_Test *this)

{
  char *message;
  internal local_38 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_30;
  _Head_base<1UL,_unsigned_int,_false> local_28;
  uint uStack_24;
  _Tuple_impl<1UL,_int> local_20;
  _Head_base<0UL,_bool,_false> local_1c;
  
  local_28._M_head_impl = 0;
  uStack_24 = uStack_24 & 0xffffff00;
  local_20.super__Head_base<1UL,_int,_false>._M_head_impl = (_Head_base<1UL,_int,_false>)0;
  local_1c._M_head_impl = false;
  testing::internal::CmpHelperEQ<std::tuple<bool,unsigned_int>,std::tuple<bool,int>>
            (local_38,"tuple.getBottom()","(std::tuple{false, 0})",
             (tuple<bool,_unsigned_int> *)&local_28,(tuple<bool,_int> *)&local_20);
  if (local_38[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_28);
    if (local_30 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_30->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_20,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/test/gtest/lattices.cpp"
               ,0x1fc,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_20,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_20);
    if ((long *)CONCAT44(uStack_24,local_28._M_head_impl) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT44(uStack_24,local_28._M_head_impl) + 8))();
    }
  }
  if (local_30 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_30,local_30);
  }
  return;
}

Assistant:

TEST(TupleLattice, GetBottom) {
  analysis::Tuple<analysis::Bool, analysis::UInt32> tuple{analysis::Bool{},
                                                          analysis::UInt32{}};
  EXPECT_EQ(tuple.getBottom(), (std::tuple{false, 0}));
}